

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssmain.cpp
# Opt level: O0

void asm_run(void)

{
  strcpy(sasm.exeInfoFilename,sasm.exeFileName);
  strcat(sasm.exeInfoFilename,".info");
  _asm_::Init();
  _asm_::LoadSourceFile();
  _asm_::AssembleSourceFile();
  _asm_::BuildSSE();
  if (sasm.isBuildInfo != 0) {
    _asm_::BuildSSE_Info();
  }
  _asm_::ShutDown();
  return;
}

Assistant:

void asm_run()
{
	strcpy(sasm.exeInfoFilename, sasm.exeFileName);
	strcat(sasm.exeInfoFilename, ".info");

	_asm_::Init();

	_asm_::LoadSourceFile();

	_asm_::AssembleSourceFile();

	_asm_::BuildSSE();

	if (sasm.isBuildInfo)
		_asm_::BuildSSE_Info();

	_asm_::ShutDown();
}